

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix.cc
# Opt level: O0

ColMatrix * __thiscall fizplex::ColMatrix::operator*(ColMatrix *this,ColMatrix *rhs)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  size_t sVar4;
  invalid_argument *this_00;
  ColMatrix *in_RDX;
  long in_RSI;
  ColMatrix *in_RDI;
  size_t i;
  double val;
  size_t col;
  size_t row;
  size_t vec_length;
  size_t col_num;
  size_t row_num;
  ColMatrix *result;
  undefined7 in_stack_ffffffffffffff58;
  double in_stack_ffffffffffffff60;
  double in_stack_ffffffffffffff68;
  ColMatrix *in_stack_ffffffffffffff70;
  size_t _n;
  size_t in_stack_ffffffffffffff98;
  ulong uVar5;
  ColMatrix *in_stack_ffffffffffffffa0;
  double val_00;
  ulong local_58;
  ulong local_50;
  
  _n = *(size_t *)(in_RSI + 0x20);
  sVar4 = row_count(in_RDX);
  if (_n == sVar4) {
    uVar1 = *(ulong *)(in_RSI + 0x18);
    sVar4 = col_count(in_RDX);
    uVar2 = *(ulong *)(in_RSI + 0x20);
    ColMatrix(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,_n);
    for (local_50 = 0; local_50 < uVar1; local_50 = local_50 + 1) {
      for (local_58 = 0; local_58 < sVar4; local_58 = local_58 + 1) {
        val_00 = 0.0;
        for (uVar5 = 0; uVar5 < uVar2; uVar5 = uVar5 + 1) {
          in_stack_ffffffffffffff68 =
               get_value(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,
                         (size_t)in_stack_ffffffffffffff60);
          in_stack_ffffffffffffff60 =
               get_value(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,
                         (size_t)in_stack_ffffffffffffff60);
          val_00 = in_stack_ffffffffffffff68 * in_stack_ffffffffffffff60 + val_00;
        }
        bVar3 = is_zero(val_00,1e-05);
        if (!bVar3) {
          add_value(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,
                    (size_t)in_stack_ffffffffffffff60,
                    (double)CONCAT17(bVar3,in_stack_ffffffffffffff58));
        }
      }
    }
    return in_RDI;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Wrong dimensions for matrix multiplication!");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ColMatrix ColMatrix::operator*(const ColMatrix &rhs) const {
  if (n != rhs.row_count())
    throw std::invalid_argument("Wrong dimensions for matrix multiplication!");
  const size_t row_num = m;
  const size_t col_num = rhs.col_count();
  const size_t vec_length = n;
  ColMatrix result(row_num, col_num);
  for (size_t row = 0; row < row_num; ++row) {
    for (size_t col = 0; col < col_num; ++col) {
      double val = 0.0;
      for (size_t i = 0; i < vec_length; ++i)
        val += get_value(row, i) * rhs.get_value(i, col);
      // matrix multipl is used for testing the inverse mainly
      // use looser equality check for this (1e-5)
      if (!is_zero(val, 1e-5))
        result.add_value(row, col, val);
    }
  }
  return result;
}